

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

bool bssl::ssl_cert_check_key_usage(CBS *in,ssl_key_usage_t bit)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uint8_t *s1;
  undefined1 local_a8 [8];
  CBS bit_string;
  CBS contents;
  CBS oid;
  CBS extension;
  CBS extensions;
  undefined1 local_50 [4];
  int has_extensions;
  CBS outer_extensions;
  CBS tbs_cert;
  CBS buf;
  ssl_key_usage_t bit_local;
  CBS *in_local;
  
  tbs_cert.len = (size_t)in->data;
  bVar1 = ssl_cert_skip_to_spki((CBS *)&tbs_cert.len,(CBS *)&outer_extensions.len);
  if ((((bVar1) &&
       (iVar2 = CBS_get_asn1((CBS *)&outer_extensions.len,(CBS *)0x0,0x20000010), iVar2 != 0)) &&
      (iVar2 = CBS_get_optional_asn1((CBS *)&outer_extensions.len,(CBS *)0x0,(int *)0x0,0x80000001),
      iVar2 != 0)) &&
     ((iVar2 = CBS_get_optional_asn1((CBS *)&outer_extensions.len,(CBS *)0x0,(int *)0x0,0x80000002),
      iVar2 != 0 &&
      (iVar2 = CBS_get_optional_asn1
                         ((CBS *)&outer_extensions.len,(CBS *)local_50,
                          (int *)((long)&extensions.len + 4),0xa0000003), iVar2 != 0)))) {
    if (extensions.len._4_4_ == 0) {
      in_local._7_1_ = true;
    }
    else {
      iVar2 = CBS_get_asn1((CBS *)local_50,(CBS *)&extension.len,0x20000010);
      if (iVar2 == 0) {
        ERR_put_error(0x10,0,0x110,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                      ,0x145);
        in_local._7_1_ = false;
      }
      else {
        do {
          do {
            sVar3 = CBS_len((CBS *)&extension.len);
            if (sVar3 == 0) {
              return true;
            }
            iVar2 = CBS_get_asn1((CBS *)&extension.len,(CBS *)&oid.len,0x20000010);
            if ((((iVar2 == 0) ||
                 (iVar2 = CBS_get_asn1((CBS *)&oid.len,(CBS *)&contents.len,6), iVar2 == 0)) ||
                ((iVar2 = CBS_peek_asn1_tag((CBS *)&oid.len,1), iVar2 != 0 &&
                 (iVar2 = CBS_get_asn1((CBS *)&oid.len,(CBS *)0x0,1), iVar2 == 0)))) ||
               ((iVar2 = CBS_get_asn1((CBS *)&oid.len,(CBS *)&bit_string.len,4), iVar2 == 0 ||
                (sVar3 = CBS_len((CBS *)&oid.len), sVar3 != 0)))) {
              ERR_put_error(0x10,0,0x110,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                            ,0x151);
              return false;
            }
            sVar3 = CBS_len((CBS *)&contents.len);
          } while (sVar3 != 3);
          s1 = CBS_data((CBS *)&contents.len);
          iVar2 = ::OPENSSL_memcmp(s1,"U\x1d\x0f",3);
        } while (iVar2 != 0);
        iVar2 = CBS_get_asn1((CBS *)&bit_string.len,(CBS *)local_a8,3);
        if ((iVar2 == 0) || (sVar3 = CBS_len((CBS *)&bit_string.len), sVar3 != 0)) {
          ERR_put_error(0x10,0,0x110,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                        ,0x15f);
          in_local._7_1_ = false;
        }
        else {
          iVar2 = CBS_is_valid_asn1_bitstring((CBS *)local_a8);
          if (iVar2 == 0) {
            ERR_put_error(0x10,0,0x110,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                          ,0x166);
            in_local._7_1_ = false;
          }
          else {
            iVar2 = CBS_asn1_bitstring_has_bit((CBS *)local_a8,bit);
            if (iVar2 == 0) {
              ERR_put_error(0x10,0,0x12e,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                            ,0x16b);
              in_local._7_1_ = false;
            }
            else {
              in_local._7_1_ = true;
            }
          }
        }
      }
    }
  }
  else {
    ERR_put_error(0x10,0,0x110,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x13b);
    in_local._7_1_ = false;
  }
  return in_local._7_1_;
}

Assistant:

bool ssl_cert_check_key_usage(const CBS *in, enum ssl_key_usage_t bit) {
  CBS buf = *in;

  CBS tbs_cert, outer_extensions;
  int has_extensions;
  if (!ssl_cert_skip_to_spki(&buf, &tbs_cert) ||
      // subjectPublicKeyInfo
      !CBS_get_asn1(&tbs_cert, NULL, CBS_ASN1_SEQUENCE) ||
      // issuerUniqueID
      !CBS_get_optional_asn1(&tbs_cert, NULL, NULL,
                             CBS_ASN1_CONTEXT_SPECIFIC | 1) ||
      // subjectUniqueID
      !CBS_get_optional_asn1(&tbs_cert, NULL, NULL,
                             CBS_ASN1_CONTEXT_SPECIFIC | 2) ||
      !CBS_get_optional_asn1(
          &tbs_cert, &outer_extensions, &has_extensions,
          CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 3)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
    return false;
  }

  if (!has_extensions) {
    return true;
  }

  CBS extensions;
  if (!CBS_get_asn1(&outer_extensions, &extensions, CBS_ASN1_SEQUENCE)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
    return false;
  }

  while (CBS_len(&extensions) > 0) {
    CBS extension, oid, contents;
    if (!CBS_get_asn1(&extensions, &extension, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&extension, &oid, CBS_ASN1_OBJECT) ||
        (CBS_peek_asn1_tag(&extension, CBS_ASN1_BOOLEAN) &&
         !CBS_get_asn1(&extension, NULL, CBS_ASN1_BOOLEAN)) ||
        !CBS_get_asn1(&extension, &contents, CBS_ASN1_OCTETSTRING) ||
        CBS_len(&extension) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
      return false;
    }

    static const uint8_t kKeyUsageOID[3] = {0x55, 0x1d, 0x0f};
    if (CBS_len(&oid) != sizeof(kKeyUsageOID) ||
        OPENSSL_memcmp(CBS_data(&oid), kKeyUsageOID, sizeof(kKeyUsageOID)) !=
            0) {
      continue;
    }

    CBS bit_string;
    if (!CBS_get_asn1(&contents, &bit_string, CBS_ASN1_BITSTRING) ||
        CBS_len(&contents) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
      return false;
    }

    // This is the KeyUsage extension. See
    // https://tools.ietf.org/html/rfc5280#section-4.2.1.3
    if (!CBS_is_valid_asn1_bitstring(&bit_string)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
      return false;
    }

    if (!CBS_asn1_bitstring_has_bit(&bit_string, bit)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_KEY_USAGE_BIT_INCORRECT);
      return false;
    }

    return true;
  }

  // No KeyUsage extension found.
  return true;
}